

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Option::get_flag_value
          (string *__return_storage_ptr__,Option *this,string *name,string *input_value)

{
  __type _Var1;
  bool bVar2;
  int iVar3;
  ptrdiff_t pVar4;
  ArgumentMismatch *pAVar5;
  int64_t iVar6;
  string *psVar7;
  allocator<char> local_101;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::trueString_abi_cxx11_ ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::trueString_abi_cxx11_), iVar3 != 0)) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                trueString_abi_cxx11_,"true",&local_101);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  trueString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         trueString_abi_cxx11_);
  }
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::falseString_abi_cxx11_ ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::falseString_abi_cxx11_), iVar3 != 0)) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                falseString_abi_cxx11_,"false",&local_101);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  falseString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         falseString_abi_cxx11_);
  }
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::emptyString_abi_cxx11_ ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::emptyString_abi_cxx11_), iVar3 != 0)) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                emptyString_abi_cxx11_,"{}",&local_101);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  emptyString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         emptyString_abi_cxx11_);
  }
  if ((((this->super_OptionBase<CLI::Option>).disable_flag_override_ == true) &&
      (input_value->_M_string_length != 0)) &&
     (_Var1 = ::std::operator==(input_value,
                                &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                                 emptyString_abi_cxx11_), !_Var1)) {
    ::std::__cxx11::string::string((string *)&local_90,(string *)name);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_e8,&this->fnames_);
    pVar4 = detail::find_member(&local_90,&local_e8,
                                (this->super_OptionBase<CLI::Option>).ignore_case_,
                                (this->super_OptionBase<CLI::Option>).ignore_underscore_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e8);
    ::std::__cxx11::string::~string((string *)&local_90);
    if (pVar4 < 0) {
      bVar2 = ::std::operator!=(input_value,
                                &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                                 trueString_abi_cxx11_);
      if (bVar2) {
        pAVar5 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string((string *)&local_70,(string *)name);
        ArgumentMismatch::FlagOverride(pAVar5,&local_70);
        __cxa_throw(pAVar5,&ArgumentMismatch::typeinfo,Error::~Error);
      }
    }
    else {
      bVar2 = ::std::operator!=(&(this->default_flag_values_).
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[pVar4].second,input_value
                               );
      if (bVar2) {
        pAVar5 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string((string *)&local_50,(string *)name);
        ArgumentMismatch::FlagOverride(pAVar5,&local_50);
        __cxa_throw(pAVar5,&ArgumentMismatch::typeinfo,Error::~Error);
      }
    }
  }
  ::std::__cxx11::string::string((string *)&local_b0,(string *)name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_100,&this->fnames_);
  pVar4 = detail::find_member(&local_b0,&local_100,
                              (this->super_OptionBase<CLI::Option>).ignore_case_,
                              (this->super_OptionBase<CLI::Option>).ignore_underscore_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100);
  ::std::__cxx11::string::~string((string *)&local_b0);
  if ((input_value->_M_string_length == 0) ||
     (_Var1 = ::std::operator==(input_value,
                                &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                                 emptyString_abi_cxx11_), _Var1)) {
    if (this->flag_like_ == true) {
      psVar7 = &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                trueString_abi_cxx11_;
      if (-1 < pVar4) {
        psVar7 = &(this->default_flag_values_).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[pVar4].second;
      }
    }
    else {
      psVar7 = &(this->default_flag_values_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[pVar4].second;
      if (pVar4 < 0) {
        psVar7 = &this->default_str_;
      }
    }
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar7);
  }
  else {
    if (-1 < pVar4) {
      psVar7 = &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                falseString_abi_cxx11_;
      _Var1 = ::std::operator==(&(this->default_flag_values_).
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[pVar4].second,
                                &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                                 falseString_abi_cxx11_);
      if (_Var1) {
        ::std::__cxx11::string::string((string *)&local_d0,(string *)input_value);
        iVar6 = detail::to_flag_value(&local_d0);
        ::std::__cxx11::string::~string((string *)&local_d0);
        if (iVar6 != 1) {
          if (iVar6 != -1) {
            std::__cxx11::to_string(__return_storage_ptr__,-iVar6);
            return __return_storage_ptr__;
          }
          psVar7 = &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                    trueString_abi_cxx11_;
        }
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar7);
        return __return_storage_ptr__;
      }
    }
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input_value);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_flag_value(const std::string &name, std::string input_value) const {
        static const std::string trueString{"true"};
        static const std::string falseString{"false"};
        static const std::string emptyString{"{}"};
        // check for disable flag override_
        if(disable_flag_override_) {
            if(!((input_value.empty()) || (input_value == emptyString))) {
                auto default_ind = detail::find_member(name, fnames_, ignore_case_, ignore_underscore_);
                if(default_ind >= 0) {
                    // We can static cast this to std::size_t because it is more than 0 in this block
                    if(default_flag_values_[static_cast<std::size_t>(default_ind)].second != input_value) {
                        throw(ArgumentMismatch::FlagOverride(name));
                    }
                } else {
                    if(input_value != trueString) {
                        throw(ArgumentMismatch::FlagOverride(name));
                    }
                }
            }
        }
        auto ind = detail::find_member(name, fnames_, ignore_case_, ignore_underscore_);
        if((input_value.empty()) || (input_value == emptyString)) {
            if(flag_like_) {
                return (ind < 0) ? trueString : default_flag_values_[static_cast<std::size_t>(ind)].second;
            } else {
                return (ind < 0) ? default_str_ : default_flag_values_[static_cast<std::size_t>(ind)].second;
            }
        }
        if(ind < 0) {
            return input_value;
        }
        if(default_flag_values_[static_cast<std::size_t>(ind)].second == falseString) {
            try {
                auto val = detail::to_flag_value(input_value);
                return (val == 1) ? falseString : (val == (-1) ? trueString : std::to_string(-val));
            } catch(const std::invalid_argument &) {
                return input_value;
            }
        } else {
            return input_value;
        }
    }